

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

GestureType QScroller::grabGesture(QObject *target,ScrollerGestureType scrollGestureType)

{
  QScrollerPrivate *pQVar1;
  GestureType GVar2;
  QScroller *pQVar3;
  QFlickGestureRecognizer *this;
  QGraphicsObject *this_00;
  MouseButton button;
  QObject *unaff_R12;
  QWidget *widget;
  
  pQVar3 = scroller(unaff_R12);
  if (pQVar3 == (QScroller *)0x0) {
    GVar2 = ~LastGestureType;
  }
  else {
    pQVar1 = pQVar3->d_ptr;
    if (pQVar1->recognizer != (QFlickGestureRecognizer *)0x0) {
      ungrabGesture(target);
    }
    button = NoButton;
    if (scrollGestureType - LeftMouseButtonGesture < 3) {
      button = *(MouseButton *)
                (&DAT_006f7e10 + (ulong)(scrollGestureType - LeftMouseButtonGesture) * 4);
    }
    this = (QFlickGestureRecognizer *)operator_new(0x10);
    QFlickGestureRecognizer::QFlickGestureRecognizer(this,button);
    pQVar1->recognizer = this;
    GVar2 = QGestureRecognizer::registerRecognizer((QGestureRecognizer *)this);
    pQVar1->recognizerType = GVar2;
    if ((*(byte *)(*(long *)(target + 8) + 0x30) & 1) == 0) {
      this_00 = (QGraphicsObject *)QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
      if (this_00 != (QGraphicsObject *)0x0) {
        if (scrollGestureType == TouchGesture) {
          QGraphicsItem::setAcceptTouchEvents((QGraphicsItem *)(this_00 + 0x10),true);
        }
        QGraphicsObject::grabGesture(this_00,pQVar1->recognizerType,(GestureFlags)0x0);
      }
    }
    else {
      QWidget::grabGesture((QWidget *)target,GVar2,(GestureFlags)0x0);
      if (scrollGestureType == TouchGesture) {
        QWidget::setAttribute((QWidget *)target,WA_AcceptTouchEvents,true);
      }
    }
    GVar2 = pQVar1->recognizerType;
  }
  return GVar2;
}

Assistant:

Qt::GestureType QScroller::grabGesture(QObject *target, ScrollerGestureType scrollGestureType)
{
    // ensure that a scroller for target is created
    QScroller *s = scroller(target);
    if (!s)
        return Qt::GestureType(0);

    QScrollerPrivate *sp = s->d_ptr;
    if (sp->recognizer)
        ungrabGesture(target); // ungrab the old gesture

    Qt::MouseButton button;
    switch (scrollGestureType) {
    case LeftMouseButtonGesture  : button = Qt::LeftButton; break;
    case RightMouseButtonGesture : button = Qt::RightButton; break;
    case MiddleMouseButtonGesture: button = Qt::MiddleButton; break;
    default                      :
    case TouchGesture            : button = Qt::NoButton; break; // NoButton == Touch
    }

    sp->recognizer = new QFlickGestureRecognizer(button);
    sp->recognizerType = QGestureRecognizer::registerRecognizer(sp->recognizer);

    if (target->isWidgetType()) {
        QWidget *widget = static_cast<QWidget *>(target);
        widget->grabGesture(sp->recognizerType);
        if (scrollGestureType == TouchGesture)
            widget->setAttribute(Qt::WA_AcceptTouchEvents);
#if QT_CONFIG(graphicsview)
    } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject*>(target)) {
        if (scrollGestureType == TouchGesture)
            go->setAcceptTouchEvents(true);
        go->grabGesture(sp->recognizerType);
#endif // QT_CONFIG(graphicsview)
    }
    return sp->recognizerType;
}